

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void mdisplay(double *A,int row,int col)

{
  ulong uVar1;
  ulong uVar2;
  
  printf("\n MATRIX Order : %d X %d \n \n");
  if (0 < row) {
    uVar2 = 0;
    do {
      printf("R%d: ",uVar2 & 0xffffffff);
      if (0 < col) {
        uVar1 = 0;
        do {
          printf("%g ",A[uVar1]);
          uVar1 = uVar1 + 1;
        } while ((uint)col != uVar1);
      }
      printf(":R%d \n",uVar2 & 0xffffffff);
      uVar2 = uVar2 + 1;
      A = A + (uint)col;
    } while (uVar2 != (uint)row);
  }
  return;
}

Assistant:

void mdisplay(double *A, int row, int col) {
	int i,j;
	printf("\n MATRIX Order : %d X %d \n \n",row,col);
	
	for (i = 0; i < row; i++) {
		printf("R%d: ",i);
		for ( j = 0; j < col;j++) {
			printf("%g ",A[i*col + j]);
		}
		printf(":R%d \n",i);
	}
}